

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

size_t __thiscall adios2::IO::AddTransport(IO *this,string *type,Params *parameters)

{
  undefined8 uVar1;
  size_t sVar2;
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000018;
  IO *in_stack_00000020;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"in call to IO::AddTransport",&local_39);
  helper::CheckForNullptr<adios2::core::IO>(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = *in_RDI;
  std::__cxx11::string::string(local_70,in_RSI);
  sVar2 = adios2::core::IO::AddTransport(uVar1,local_70,local_18);
  std::__cxx11::string::~string(local_70);
  return sVar2;
}

Assistant:

size_t IO::AddTransport(const std::string type, const Params &parameters)
{
    helper::CheckForNullptr(m_IO, "in call to IO::AddTransport");
    return m_IO->AddTransport(type, parameters);
}